

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O0

void flow::lang::completeDefaultValue
               (ParamList *args,LiteralType type,DefaultValue *dv,string *name)

{
  string *name_00;
  ParamList *this;
  int iVar1;
  SourceLocation *pSVar2;
  IPAddress *__args_1;
  Cidr *__args_1_00;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> local_60;
  unique_ptr<flow::lang::LiteralExpr<long_long>,_std::default_delete<flow::lang::LiteralExpr<long_long>_>_>
  local_58;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> local_50;
  unique_ptr<flow::lang::LiteralExpr<bool>,_std::default_delete<flow::lang::LiteralExpr<bool>_>_>
  local_48;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> local_40 [3];
  string *local_28;
  string *name_local;
  DefaultValue *dv_local;
  ParamList *pPStack_10;
  LiteralType type_local;
  ParamList *args_local;
  
  local_28 = name;
  name_local = (string *)dv;
  dv_local._4_4_ = type;
  pPStack_10 = args;
  if ((completeDefaultValue(flow::lang::ParamList&,flow::LiteralType,std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>const&,std::__cxx11::string_const&)
       ::loc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&completeDefaultValue(flow::lang::ParamList&,flow::LiteralType,std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>const&,std::__cxx11::string_const&)
                                   ::loc), iVar1 != 0)) {
    SourceLocation::SourceLocation(&completeDefaultValue::loc);
    __cxa_atexit(SourceLocation::~SourceLocation,&completeDefaultValue::loc,&__dso_handle);
    __cxa_guard_release(&completeDefaultValue(flow::lang::ParamList&,flow::LiteralType,std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>const&,std::__cxx11::string_const&)
                         ::loc);
  }
  this = pPStack_10;
  name_00 = local_28;
  switch(dv_local._4_4_) {
  case Boolean:
    pSVar2 = (SourceLocation *)
             std::
             get<bool,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       ((variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                         *)name_local);
    std::make_unique<flow::lang::LiteralExpr<bool>,bool_const&,flow::SourceLocation_const&>
              ((bool *)&local_48,pSVar2);
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
    unique_ptr<flow::lang::LiteralExpr<bool>,std::default_delete<flow::lang::LiteralExpr<bool>>,void>
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)local_40,
               &local_48);
    ParamList::push_back(this,name_00,local_40);
    std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr(local_40)
    ;
    std::
    unique_ptr<flow::lang::LiteralExpr<bool>,_std::default_delete<flow::lang::LiteralExpr<bool>_>_>
    ::~unique_ptr(&local_48);
    break;
  case Number:
    pSVar2 = (SourceLocation *)
             std::
             get<long,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       ((variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                         *)name_local);
    std::make_unique<flow::lang::LiteralExpr<long_long>,long_const&,flow::SourceLocation_const&>
              ((long *)&local_58,pSVar2);
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
    unique_ptr<flow::lang::LiteralExpr<long_long>,std::default_delete<flow::lang::LiteralExpr<long_long>>,void>
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)&local_50,
               &local_58);
    ParamList::push_back(this,name_00,&local_50);
    std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
              (&local_50);
    std::
    unique_ptr<flow::lang::LiteralExpr<long_long>,_std::default_delete<flow::lang::LiteralExpr<long_long>_>_>
    ::~unique_ptr(&local_58);
    break;
  case String:
    pSVar2 = (SourceLocation *)
             std::
             get<std::__cxx11::string,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       ((variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                         *)name_local);
    std::
    make_unique<flow::lang::LiteralExpr<std::__cxx11::string>,std::__cxx11::string_const&,flow::SourceLocation_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,pSVar2)
    ;
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
    unique_ptr<flow::lang::LiteralExpr<std::__cxx11::string>,std::default_delete<flow::lang::LiteralExpr<std::__cxx11::string>>,void>
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)&local_60,
               (unique_ptr<flow::lang::LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<flow::lang::LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_68);
    ParamList::push_back(this,name_00,&local_60);
    std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
              (&local_60);
    std::
    unique_ptr<flow::lang::LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<flow::lang::LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unique_ptr((unique_ptr<flow::lang::LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<flow::lang::LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_68);
    break;
  default:
    fprintf(_stderr,"Unsupported type in default completion. Please report me. I am a bug.");
    abort();
  case IPAddress:
    __args_1 = std::
               get<flow::util::IPAddress,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                         ((variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                           *)name_local);
    std::
    make_unique<flow::lang::LiteralExpr<flow::util::IPAddress>,flow::util::IPAddress_const&,flow::SourceLocation_const&>
              ((IPAddress *)local_78,(SourceLocation *)__args_1);
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
    unique_ptr<flow::lang::LiteralExpr<flow::util::IPAddress>,std::default_delete<flow::lang::LiteralExpr<flow::util::IPAddress>>,void>
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)(local_78 + 8),
               (unique_ptr<flow::lang::LiteralExpr<flow::util::IPAddress>,_std::default_delete<flow::lang::LiteralExpr<flow::util::IPAddress>_>_>
                *)local_78);
    ParamList::push_back
              (this,name_00,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
               (local_78 + 8));
    std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
              ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
               (local_78 + 8));
    std::
    unique_ptr<flow::lang::LiteralExpr<flow::util::IPAddress>,_std::default_delete<flow::lang::LiteralExpr<flow::util::IPAddress>_>_>
    ::~unique_ptr((unique_ptr<flow::lang::LiteralExpr<flow::util::IPAddress>,_std::default_delete<flow::lang::LiteralExpr<flow::util::IPAddress>_>_>
                   *)local_78);
    break;
  case Cidr:
    __args_1_00 = std::
                  get<flow::util::Cidr,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                            ((variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                              *)name_local);
    std::
    make_unique<flow::lang::LiteralExpr<flow::util::Cidr>,flow::util::Cidr_const&,flow::SourceLocation_const&>
              ((Cidr *)local_88,(SourceLocation *)__args_1_00);
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
    unique_ptr<flow::lang::LiteralExpr<flow::util::Cidr>,std::default_delete<flow::lang::LiteralExpr<flow::util::Cidr>>,void>
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)(local_88 + 8),
               (unique_ptr<flow::lang::LiteralExpr<flow::util::Cidr>,_std::default_delete<flow::lang::LiteralExpr<flow::util::Cidr>_>_>
                *)local_88);
    ParamList::push_back
              (this,name_00,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
               (local_88 + 8));
    std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
              ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
               (local_88 + 8));
    std::
    unique_ptr<flow::lang::LiteralExpr<flow::util::Cidr>,_std::default_delete<flow::lang::LiteralExpr<flow::util::Cidr>_>_>
    ::~unique_ptr((unique_ptr<flow::lang::LiteralExpr<flow::util::Cidr>,_std::default_delete<flow::lang::LiteralExpr<flow::util::Cidr>_>_>
                   *)local_88);
  }
  return;
}

Assistant:

static inline void completeDefaultValue(
    ParamList& args,
    LiteralType type,
    const NativeCallback::DefaultValue& dv,
    const std::string& name) { // {{{
  // printf("completeDefaultValue(type:%s, name:%s)\n", tos(type).c_str(),
  // name.c_str());

  static const SourceLocation loc;

  switch (type) {
    case LiteralType::Boolean:
      args.push_back(
          name,
          std::make_unique<BoolExpr>(std::get<bool>(dv), loc));
      break;
    case LiteralType::Number:
      args.push_back(
          name,
          std::make_unique<NumberExpr>(std::get<FlowNumber>(dv), loc));
      break;
    case LiteralType::String:
      args.push_back(
          name,
          std::make_unique<StringExpr>(std::get<FlowString>(dv), loc));
      break;
    case LiteralType::IPAddress:
      args.push_back(
          name,
          std::make_unique<IPAddressExpr>(std::get<util::IPAddress>(dv), loc));
      break;
    case LiteralType::Cidr:
      args.push_back(
          name,
          std::make_unique<CidrExpr>(std::get<util::Cidr>(dv), loc));
      break;
    default:
      fprintf(stderr, "Unsupported type in default completion. Please report me. I am a bug.");
      abort();
      // reportError("Cannot complete named paramter \"%s\" in callee \"%s\".
      // Unsupported type <%s>.",
      //        name.c_str(), this->name().c_str(), tos(type).c_str());
      break;
  }
}